

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

wchar_t * __thiscall
fmt::v6::internal::format_uint<4u,wchar_t,unsigned__int128>
          (internal *this,wchar_t *buffer,unsigned___int128 value,int num_digits,bool upper)

{
  char *pcVar1;
  undefined7 in_register_00000009;
  undefined4 in_register_00000014;
  byte in_R8B;
  uint digit;
  char *digits;
  wchar_t *end;
  bool upper_local;
  int num_digits_local;
  unsigned___int128 value_local;
  wchar_t *buffer_local;
  
  value_local._8_8_ = CONCAT44(in_register_00000014,num_digits);
  value_local._0_8_ = buffer;
  buffer_local = (wchar_t *)(this + (long)(int)CONCAT71(in_register_00000009,upper) * 4);
  do {
    pcVar1 = "0123456789abcdef";
    if ((in_R8B & 1) != 0) {
      pcVar1 = "0123456789ABCDEF";
    }
    buffer_local[-1] = (int)pcVar1[(uint)value_local & 0xf];
    value_local._0_8_ = (wchar_t *)(value_local._8_8_ << 0x3c | (ulong)(wchar_t *)value_local >> 4);
    value_local._8_8_ = value_local._8_8_ >> 4;
    buffer_local = buffer_local + -1;
  } while ((wchar_t *)value_local != (wchar_t *)0x0 || value_local._8_8_ != 0);
  return (wchar_t *)(this + (long)(int)CONCAT71(in_register_00000009,upper) * 4);
}

Assistant:

inline Char* format_uint(Char* buffer, UInt value, int num_digits,
                         bool upper = false) {
  buffer += num_digits;
  Char* end = buffer;
  do {
    const char* digits = upper ? "0123456789ABCDEF" : data::hex_digits;
    unsigned digit = (value & ((1 << BASE_BITS) - 1));
    *--buffer = static_cast<Char>(BASE_BITS < 4 ? static_cast<char>('0' + digit)
                                                : digits[digit]);
  } while ((value >>= BASE_BITS) != 0);
  return end;
}